

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O1

parser_error parse_object_property_name(parser *p)

{
  char *pcVar1;
  void *pvVar2;
  undefined8 *v;
  long lVar3;
  
  pcVar1 = parser_getstr(p,"name");
  pvVar2 = parser_priv(p);
  v = (undefined8 *)mem_zalloc(0xf0);
  *v = pvVar2;
  parser_setpriv(p,v);
  pcVar1 = string_make(pcVar1);
  v[0x16] = pcVar1;
  lVar3 = 8;
  do {
    *(undefined4 *)((long)v + lVar3 * 4) = 1;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x2c);
  return PARSE_ERROR_NONE;
}

Assistant:

static enum parser_error parse_object_property_name(struct parser *p) {
	const char *name = parser_getstr(p, "name");
	struct obj_property *h = parser_priv(p);
	struct obj_property *prop = mem_zalloc(sizeof *prop);
	int i;

	prop->next = h;
	parser_setpriv(p, prop);
	prop->name = string_make(name);

	/* Set all the type multipliers to the default of 1 */
	for (i = 0; i < TV_MAX; i++) {
		prop->type_mult[i] = 1;
	}
	return PARSE_ERROR_NONE;
}